

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_create.cpp
# Opt level: O2

LogicalType * __thiscall
duckdb::Binder::BindLogicalTypeInternal
          (LogicalType *__return_storage_ptr__,Binder *this,LogicalType *type,
          optional_ptr<duckdb::Catalog,_true> catalog,string *schema)

{
  size_type sVar1;
  bool bVar2;
  string *psVar3;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> *__x;
  Catalog *pCVar4;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *__x_00;
  CatalogEntry *pCVar5;
  LogicalType *pLVar6;
  idx_t iVar7;
  ExtensionTypeInfo *args;
  BinderException *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  ulong index;
  EntryLookupInfo *this_01;
  _Alloc_hider __args;
  optional_ptr<duckdb::Catalog,_true> catalog_local;
  string user_type_schema;
  optional_ptr<duckdb::CatalogEntry,_true> entry;
  allocator local_192;
  allocator local_191;
  LogicalType *local_190;
  EntryLookupInfo type_lookup;
  string type_catalog;
  string user_type_name;
  string type_schema;
  __uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
  local_100;
  optional_idx local_f8;
  vector<duckdb::Value,_true> user_type_mods;
  EntryLookupInfo local_d8;
  child_list_t<LogicalType> local_b8;
  string local_a0;
  LogicalType local_80;
  LogicalType local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  catalog_local = catalog;
  local_190 = __return_storage_ptr__;
  if (type->id_ == USER) {
    psVar3 = UserType::GetTypeName_abi_cxx11_(type);
    ::std::__cxx11::string::string((string *)&user_type_name,(string *)psVar3);
    psVar3 = UserType::GetSchema_abi_cxx11_(type);
    ::std::__cxx11::string::string((string *)&user_type_schema,(string *)psVar3);
    __x = &UserType::GetTypeModifiers(type)->
           super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>;
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&user_type_mods,__x);
    LogicalType::LogicalType(__return_storage_ptr__);
    EntryLookupInfo::EntryLookupInfo
              (&type_lookup,TYPE_ENTRY,&user_type_name,(QueryErrorContext)0xffffffffffffffff);
    if (catalog_local.ptr == (Catalog *)0x0) {
      psVar3 = UserType::GetCatalog_abi_cxx11_(type);
      ::std::__cxx11::string::string((string *)&type_catalog,(string *)psVar3);
      psVar3 = UserType::GetSchema_abi_cxx11_(type);
      ::std::__cxx11::string::string((string *)&type_schema,(string *)psVar3);
      BindSchemaOrCatalog(this->context,&type_catalog,&type_schema);
      entry = CatalogEntryRetriever::GetEntry
                        (&this->entry_retriever,&type_catalog,&type_schema,&type_lookup,
                         THROW_EXCEPTION);
      pCVar5 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&entry);
      pLVar6 = local_190;
      LogicalType::operator=(local_190,(LogicalType *)&pCVar5[1].timestamp);
      p_Var8 = pCVar5[1].comment.type_.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      ::std::__cxx11::string::~string((string *)&type_schema);
      ::std::__cxx11::string::~string((string *)&type_catalog);
    }
    else {
      entry.ptr = (CatalogEntry *)0x0;
      if (user_type_schema._M_string_length != 0) {
        pCVar4 = optional_ptr<duckdb::Catalog,_true>::operator*(&catalog_local);
        entry = CatalogEntryRetriever::GetEntry
                          (&this->entry_retriever,pCVar4,&user_type_schema,&type_lookup,RETURN_NULL)
        ;
      }
      bVar2 = IsValidUserType((optional_ptr<duckdb::CatalogEntry,_true>)0x5df72c);
      if (!bVar2) {
        pCVar4 = optional_ptr<duckdb::Catalog,_true>::operator*(&catalog_local);
        entry = CatalogEntryRetriever::GetEntry
                          (&this->entry_retriever,pCVar4,schema,&type_lookup,RETURN_NULL);
      }
      bVar2 = IsValidUserType((optional_ptr<duckdb::CatalogEntry,_true>)0x5df765);
      if (!bVar2) {
        pCVar4 = optional_ptr<duckdb::Catalog,_true>::operator*(&catalog_local);
        ::std::__cxx11::string::string
                  ((string *)&type_catalog,anon_var_dwarf_4b71df5 + 9,(allocator *)&type_schema);
        entry = CatalogEntryRetriever::GetEntry
                          (&this->entry_retriever,pCVar4,&type_catalog,&type_lookup,RETURN_NULL);
        ::std::__cxx11::string::~string((string *)&type_catalog);
      }
      bVar2 = IsValidUserType((optional_ptr<duckdb::CatalogEntry,_true>)0x5df7cd);
      if (!bVar2) {
        ::std::__cxx11::string::string
                  ((string *)&type_catalog,anon_var_dwarf_4b71df5 + 9,&local_191);
        ::std::__cxx11::string::string((string *)&type_schema,anon_var_dwarf_4b71df5 + 9,&local_192)
        ;
        entry = CatalogEntryRetriever::GetEntry
                          (&this->entry_retriever,&type_catalog,&type_schema,&type_lookup,
                           THROW_EXCEPTION);
        ::std::__cxx11::string::~string((string *)&type_schema);
        ::std::__cxx11::string::~string((string *)&type_catalog);
      }
      pCVar5 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&entry);
      pLVar6 = local_190;
      LogicalType::operator=(local_190,(LogicalType *)&pCVar5[1].timestamp);
      p_Var8 = pCVar5[1].comment.type_.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
    }
    BindLogicalType(this,pLVar6,catalog_local,schema);
    pLVar6 = local_190;
    if (p_Var8 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (user_type_mods.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_start !=
          user_type_mods.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        this_00 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&type_catalog,"Type \'%s\' does not take any type modifiers",
                   (allocator *)&type_schema);
        ::std::__cxx11::string::string((string *)&local_50,(string *)&user_type_name);
        BinderException::BinderException<std::__cxx11::string>(this_00,&type_catalog,&local_50);
        __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      type_catalog._M_dataplus._M_p = (pointer)this->context;
      type_catalog._M_string_length = (size_type)local_190;
      type_catalog.field_2._M_allocated_capacity =
           (size_type)(vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&user_type_mods;
      (*(code *)p_Var8)(&type_schema);
      LogicalType::operator=(pLVar6,(LogicalType *)&type_schema);
      LogicalType::~LogicalType((LogicalType *)&type_schema);
    }
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&user_type_mods);
    ::std::__cxx11::string::~string((string *)&user_type_schema);
    ::std::__cxx11::string::~string((string *)&user_type_name);
    return local_190;
  }
  LogicalType::LogicalType((LogicalType *)&user_type_name);
  switch(type->id_) {
  case STRUCT:
    __x_00 = &StructType::GetChildTypes_abi_cxx11_(type)->
              super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ;
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&user_type_schema,__x_00);
    sVar1 = user_type_schema._M_string_length;
    type_lookup.at_clause.ptr = (BoundAtClause *)0x0;
    type_lookup.catalog_type = INVALID;
    type_lookup._1_7_ = 0;
    type_lookup.name = (string *)0x0;
    for (__args = user_type_schema._M_dataplus; __args._M_p != (pointer)sVar1;
        __args._M_p = (pointer)((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)__args._M_p + 0x20))->field_2 + 8)) {
      BindLogicalTypeInternal
                ((LogicalType *)&type_catalog,this,(LogicalType *)((long)__args._M_p + 0x20),
                 catalog_local,schema);
      ::std::
      vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
      ::emplace_back<std::__cxx11::string&,duckdb::LogicalType>
                ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                  *)&type_lookup,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args._M_p,
                 (LogicalType *)&type_catalog);
      LogicalType::~LogicalType((LogicalType *)&type_catalog);
    }
    local_b8.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)type_lookup._0_8_;
    local_b8.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)type_lookup.name;
    local_b8.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)type_lookup.at_clause.ptr;
    type_lookup.catalog_type = INVALID;
    type_lookup._1_7_ = 0;
    type_lookup.name = (string *)0x0;
    type_lookup.at_clause.ptr = (BoundAtClause *)0x0;
    LogicalType::STRUCT((LogicalType *)&type_catalog,&local_b8);
    LogicalType::operator=((LogicalType *)&user_type_name,(LogicalType *)&type_catalog);
    LogicalType::~LogicalType((LogicalType *)&type_catalog);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_b8);
    this_01 = &type_lookup;
    break;
  case LIST:
    pLVar6 = ListType::GetChildType(type);
    BindLogicalTypeInternal((LogicalType *)&user_type_schema,this,pLVar6,catalog_local,schema);
    LogicalType::LIST((LogicalType *)&type_lookup,(LogicalType *)&user_type_schema);
    goto LAB_005dfac9;
  case MAP:
    pLVar6 = MapType::KeyType(type);
    BindLogicalTypeInternal((LogicalType *)&user_type_schema,this,pLVar6,catalog_local,schema);
    pLVar6 = MapType::ValueType(type);
    BindLogicalTypeInternal((LogicalType *)&type_lookup,this,pLVar6,catalog_local,schema);
    LogicalType::LogicalType(&local_68,(LogicalType *)&user_type_schema);
    LogicalType::LogicalType(&local_80,(LogicalType *)&type_lookup);
    LogicalType::MAP((LogicalType *)&type_catalog,&local_68,&local_80);
    LogicalType::operator=((LogicalType *)&user_type_name,(LogicalType *)&type_catalog);
    LogicalType::~LogicalType((LogicalType *)&type_catalog);
    LogicalType::~LogicalType(&local_80);
    LogicalType::~LogicalType(&local_68);
    goto LAB_005dfae1;
  default:
    LogicalType::LogicalType(__return_storage_ptr__,type);
    goto LAB_005dfc6f;
  case UNION:
    user_type_schema.field_2._M_allocated_capacity = 0;
    user_type_schema._M_dataplus._M_p = (pointer)0x0;
    user_type_schema._M_string_length = 0;
    for (index = 0; iVar7 = UnionType::GetMemberCount(type), index < iVar7; index = index + 1) {
      pLVar6 = UnionType::GetMemberType(type,index);
      BindLogicalTypeInternal((LogicalType *)&type_lookup,this,pLVar6,catalog_local,schema);
      psVar3 = UnionType::GetMemberName_abi_cxx11_(type,index);
      ::std::
      vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
      ::emplace_back<std::__cxx11::string_const&,duckdb::LogicalType>
                ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                  *)&user_type_schema,psVar3,(LogicalType *)&type_lookup);
      LogicalType::~LogicalType((LogicalType *)&type_lookup);
    }
    local_d8._0_8_ = user_type_schema._M_dataplus._M_p;
    local_d8.name = (string *)user_type_schema._M_string_length;
    local_d8.at_clause.ptr = (BoundAtClause *)user_type_schema.field_2._M_allocated_capacity;
    user_type_schema._M_dataplus._M_p = (pointer)0x0;
    user_type_schema._M_string_length = 0;
    user_type_schema.field_2._M_allocated_capacity = 0;
    LogicalType::UNION((LogicalType *)&type_lookup,(child_list_t<LogicalType> *)&local_d8);
    LogicalType::operator=((LogicalType *)&user_type_name,(LogicalType *)&type_lookup);
    LogicalType::~LogicalType((LogicalType *)&type_lookup);
    this_01 = &local_d8;
    break;
  case ARRAY:
    pLVar6 = ArrayType::GetChildType(type);
    BindLogicalTypeInternal((LogicalType *)&user_type_schema,this,pLVar6,catalog_local,schema);
    iVar7 = ArrayType::GetSize(type);
    optional_idx::optional_idx(&local_f8,iVar7);
    LogicalType::ARRAY((LogicalType *)&type_lookup,(LogicalType *)&user_type_schema,local_f8);
LAB_005dfac9:
    LogicalType::operator=((LogicalType *)&user_type_name,(LogicalType *)&type_lookup);
LAB_005dfae1:
    LogicalType::~LogicalType((LogicalType *)&type_lookup);
    LogicalType::~LogicalType((LogicalType *)&user_type_schema);
    goto LAB_005dfbbc;
  }
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)this_01);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)&user_type_schema);
LAB_005dfbbc:
  LogicalType::GetAlias_abi_cxx11_(&local_a0,type);
  __return_storage_ptr__ = local_190;
  LogicalType::SetAlias((LogicalType *)&user_type_name,&local_a0);
  ::std::__cxx11::string::~string((string *)&local_a0);
  bVar2 = LogicalType::HasExtensionInfo(type);
  if (bVar2) {
    type_lookup._0_8_ = LogicalType::GetExtensionInfo(type);
    args = optional_ptr<const_duckdb::ExtensionTypeInfo,_true>::operator*
                     ((optional_ptr<const_duckdb::ExtensionTypeInfo,_true> *)&type_lookup);
    make_uniq<duckdb::ExtensionTypeInfo,duckdb::ExtensionTypeInfo_const&>
              ((duckdb *)&user_type_schema,args);
    local_100._M_t.
    super__Tuple_impl<0UL,_duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>
    .super__Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false>._M_head_impl =
         (tuple<duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>)
         (tuple<duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>)
         user_type_schema._M_dataplus;
  }
  else {
    local_100._M_t.
    super__Tuple_impl<0UL,_duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>
    .super__Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false>._M_head_impl =
         (tuple<duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>)
         (_Tuple_impl<0UL,_duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>
          )0x0;
  }
  user_type_schema._M_dataplus._M_p = (pointer)0x0;
  LogicalType::SetExtensionInfo
            ((LogicalType *)&user_type_name,
             (unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true>
              *)&local_100);
  std::unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>::
  ~unique_ptr((unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
               *)&local_100);
  LogicalType::LogicalType(__return_storage_ptr__,(LogicalType *)&user_type_name);
  std::unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>::
  ~unique_ptr((unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
               *)&user_type_schema);
LAB_005dfc6f:
  LogicalType::~LogicalType((LogicalType *)&user_type_name);
  return __return_storage_ptr__;
}

Assistant:

LogicalType Binder::BindLogicalTypeInternal(const LogicalType &type, optional_ptr<Catalog> catalog,
                                            const string &schema) {
	if (type.id() != LogicalTypeId::USER) {
		// Nested type, make sure to bind any nested user types recursively
		LogicalType result;
		switch (type.id()) {
		case LogicalTypeId::LIST: {
			auto child_type = BindLogicalTypeInternal(ListType::GetChildType(type), catalog, schema);
			result = LogicalType::LIST(child_type);
			break;
		}
		case LogicalTypeId::MAP: {
			auto key_type = BindLogicalTypeInternal(MapType::KeyType(type), catalog, schema);
			auto value_type = BindLogicalTypeInternal(MapType::ValueType(type), catalog, schema);
			result = LogicalType::MAP(std::move(key_type), std::move(value_type));
			break;
		}
		case LogicalTypeId::ARRAY: {
			auto child_type = BindLogicalTypeInternal(ArrayType::GetChildType(type), catalog, schema);
			auto array_size = ArrayType::GetSize(type);
			result = LogicalType::ARRAY(child_type, array_size);
			break;
		}
		case LogicalTypeId::STRUCT: {
			auto child_types = StructType::GetChildTypes(type);
			child_list_t<LogicalType> new_child_types;
			for (auto &entry : child_types) {
				new_child_types.emplace_back(entry.first, BindLogicalTypeInternal(entry.second, catalog, schema));
			}
			result = LogicalType::STRUCT(std::move(new_child_types));
			break;
		}
		case LogicalTypeId::UNION: {
			child_list_t<LogicalType> member_types;
			for (idx_t i = 0; i < UnionType::GetMemberCount(type); i++) {
				auto child_type = BindLogicalTypeInternal(UnionType::GetMemberType(type, i), catalog, schema);
				member_types.emplace_back(UnionType::GetMemberName(type, i), std::move(child_type));
			}
			result = LogicalType::UNION(std::move(member_types));
			break;
		}
		default:
			return type;
		}

		// Set the alias and extension info back
		result.SetAlias(type.GetAlias());
		auto ext_info = type.HasExtensionInfo() ? make_uniq<ExtensionTypeInfo>(*type.GetExtensionInfo()) : nullptr;
		result.SetExtensionInfo(std::move(ext_info));
		return result;
	}

	// User type, bind the user type
	auto user_type_name = UserType::GetTypeName(type);
	auto user_type_schema = UserType::GetSchema(type);
	auto user_type_mods = UserType::GetTypeModifiers(type);

	bind_logical_type_function_t user_bind_modifiers_func = nullptr;

	LogicalType result;
	EntryLookupInfo type_lookup(CatalogType::TYPE_ENTRY, user_type_name);
	if (catalog) {
		// The search order is:
		// 1) In the explicitly set schema (my_schema.my_type)
		// 2) In the same schema as the table
		// 3) In the same catalog
		// 4) System catalog

		optional_ptr<CatalogEntry> entry = nullptr;
		if (!user_type_schema.empty()) {
			entry = entry_retriever.GetEntry(*catalog, user_type_schema, type_lookup, OnEntryNotFound::RETURN_NULL);
		}
		if (!IsValidUserType(entry)) {
			entry = entry_retriever.GetEntry(*catalog, schema, type_lookup, OnEntryNotFound::RETURN_NULL);
		}
		if (!IsValidUserType(entry)) {
			entry = entry_retriever.GetEntry(*catalog, INVALID_SCHEMA, type_lookup, OnEntryNotFound::RETURN_NULL);
		}
		if (!IsValidUserType(entry)) {
			entry = entry_retriever.GetEntry(INVALID_CATALOG, INVALID_SCHEMA, type_lookup,
			                                 OnEntryNotFound::THROW_EXCEPTION);
		}
		auto &type_entry = entry->Cast<TypeCatalogEntry>();
		result = type_entry.user_type;
		user_bind_modifiers_func = type_entry.bind_function;
	} else {
		string type_catalog = UserType::GetCatalog(type);
		string type_schema = UserType::GetSchema(type);

		BindSchemaOrCatalog(context, type_catalog, type_schema);
		auto entry = entry_retriever.GetEntry(type_catalog, type_schema, type_lookup);
		auto &type_entry = entry->Cast<TypeCatalogEntry>();
		result = type_entry.user_type;
		user_bind_modifiers_func = type_entry.bind_function;
	}

	// Now we bind the inner user type
	BindLogicalType(result, catalog, schema);

	// Apply the type modifiers (if any)
	if (user_bind_modifiers_func) {
		// If an explicit bind_modifiers function was provided, use that to construct the type

		BindLogicalTypeInput input {context, result, user_type_mods};
		result = user_bind_modifiers_func(input);
	} else {
		if (!user_type_mods.empty()) {
			throw BinderException("Type '%s' does not take any type modifiers", user_type_name);
		}
	}
	return result;
}